

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_tEXt(ucvector *out,char *keyword,char *textstring)

{
  undefined1 local_50 [8];
  ucvector text;
  size_t i;
  uint error;
  char *textstring_local;
  char *keyword_local;
  ucvector *out_local;
  
  ucvector_init((ucvector *)local_50);
  for (text.allocsize = 0; keyword[text.allocsize] != '\0'; text.allocsize = text.allocsize + 1) {
    ucvector_push_back((ucvector *)local_50,keyword[text.allocsize]);
  }
  if ((text.allocsize == 0) || (0x4f < text.allocsize)) {
    out_local._4_4_ = 0x59;
  }
  else {
    ucvector_push_back((ucvector *)local_50,'\0');
    for (text.allocsize = 0; textstring[text.allocsize] != '\0'; text.allocsize = text.allocsize + 1
        ) {
      ucvector_push_back((ucvector *)local_50,textstring[text.allocsize]);
    }
    out_local._4_4_ = addChunk(out,"tEXt",(uchar *)local_50,(size_t)text.data);
    ucvector_cleanup(local_50);
  }
  return out_local._4_4_;
}

Assistant:

static unsigned addChunk_tEXt(ucvector* out, const char* keyword, const char* textstring)
{
  unsigned error = 0;
  size_t i;
  ucvector text;
  ucvector_init(&text);
  for(i = 0; keyword[i] != 0; ++i) ucvector_push_back(&text, (unsigned char)keyword[i]);
  if(i < 1 || i > 79) return 89; /*error: invalid keyword size*/
  ucvector_push_back(&text, 0); /*0 termination char*/
  for(i = 0; textstring[i] != 0; ++i) ucvector_push_back(&text, (unsigned char)textstring[i]);
  error = addChunk(out, "tEXt", text.data, text.size);
  ucvector_cleanup(&text);

  return error;
}